

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashtbl.c
# Opt level: O1

void tommy_hashtable_insert
               (tommy_hashtable *hashtable,tommy_hashtable_node *node,void *data,tommy_hash_t hash)

{
  long lVar1;
  tommy_hashtable_node *ptVar2;
  uint uVar3;
  tommy_node_struct *ptVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = hashtable->bucket_mask & hash;
  ptVar2 = hashtable->bucket[uVar3];
  if (ptVar2 == (tommy_hashtable_node *)0x0) {
    ptVar4 = (tommy_node_struct *)(hashtable->bucket + uVar3);
    node->prev = node;
    node->next = (tommy_node_struct *)0x0;
  }
  else {
    node->prev = ptVar2->prev;
    ptVar2->prev = node;
    node->next = (tommy_node_struct *)0x0;
    ptVar4 = node->prev;
  }
  ptVar4->next = node;
  node->data = data;
  node->key = hash;
  hashtable->count = hashtable->count + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_hashtable_insert(tommy_hashtable* hashtable, tommy_hashtable_node* node, void* data, tommy_hash_t hash)
{
	tommy_count_t pos = hash & hashtable->bucket_mask;

	tommy_list_insert_tail(&hashtable->bucket[pos], node, data);

	node->key = hash;

	++hashtable->count;
}